

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurface::Evaluate
          (ON_OffsetSurface *this,double s,double t,int der_count,int v_stride,double *v,int side,
          int *hint)

{
  int iVar1;
  double **local_210;
  int local_204;
  undefined1 local_1e8 [8];
  ON_3dVector Nt;
  ON_3dVector Ns;
  ON_3dVector N;
  double *d;
  double darray [21];
  undefined1 auStack_e8 [7];
  bool rc;
  ON_3dVector srf_value [6];
  double *local_50;
  double *vv;
  int vv_stride;
  int *hint_local;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  double s_local;
  ON_OffsetSurface *this_local;
  
  local_50 = v;
  vv._4_4_ = v_stride;
  if (der_count < 2) {
    local_50 = (double *)auStack_e8;
    vv._4_4_ = 3;
  }
  local_204 = der_count;
  if (der_count < 3) {
    local_204 = 2;
  }
  darray[0x14]._7_1_ =
       ON_SurfaceProxy::Evaluate
                 (&this->super_ON_SurfaceProxy,s,t,local_204,vv._4_4_,local_50,side,hint);
  if (v == local_50) {
    ON_3dVector::operator=((ON_3dVector *)auStack_e8,v);
    ON_3dVector::operator=((ON_3dVector *)&srf_value[0].z,v + v_stride);
    ON_3dVector::operator=((ON_3dVector *)&srf_value[1].z,v + (v_stride << 1));
    ON_3dVector::operator=((ON_3dVector *)&srf_value[2].z,v + v_stride * 3);
    ON_3dVector::operator=((ON_3dVector *)&srf_value[3].z,v + (v_stride << 2));
    ON_3dVector::operator=((ON_3dVector *)&srf_value[4].z,v + v_stride * 5);
  }
  else {
    *v = _auStack_e8;
    v[1] = srf_value[0].x;
    v[2] = srf_value[0].y;
    if (0 < der_count) {
      v[v_stride] = srf_value[0].z;
      v[v_stride + 1] = srf_value[1].x;
      v[v_stride + 2] = srf_value[1].y;
      v[v_stride << 1] = srf_value[1].z;
      v[v_stride * 2 + 1] = srf_value[2].x;
      v[v_stride * 2 + 2] = srf_value[2].y;
    }
  }
  if ((darray[0x14]._7_1_ & 1) != 0) {
    if (der_count < 6) {
      local_210 = &d;
    }
    else {
      local_210 = (double **)onmalloc((long)(((der_count + 1) * (der_count + 2)) / 2) << 3);
    }
    darray[0x14]._7_1_ =
         ON_OffsetSurfaceFunction::EvaluateDistance
                   (&this->m_offset_function,s,t,der_count,(double *)local_210);
    if ((bool)darray[0x14]._7_1_) {
      ON_EvNormal(side,(ON_3dVector *)&srf_value[0].z,(ON_3dVector *)&srf_value[1].z,
                  (ON_3dVector *)&srf_value[2].z,(ON_3dVector *)&srf_value[3].z,
                  (ON_3dVector *)&srf_value[4].z,(ON_3dVector *)&Ns.z);
      *v = (double)*local_210 * Ns.z + *v;
      v[1] = (double)*local_210 * N.x + v[1];
      v[2] = (double)*local_210 * N.y + v[2];
      if (0 < der_count) {
        ON_EvNormalPartials((ON_3dVector *)&srf_value[0].z,(ON_3dVector *)&srf_value[1].z,
                            (ON_3dVector *)&srf_value[2].z,(ON_3dVector *)&srf_value[3].z,
                            (ON_3dVector *)&srf_value[4].z,(ON_3dVector *)&Nt.z,
                            (ON_3dVector *)local_1e8);
        v[v_stride] = (double)*local_210 * Nt.z + (double)local_210[1] * Ns.z + v[v_stride];
        v[v_stride + 1] = (double)*local_210 * Ns.x + (double)local_210[1] * N.x + v[v_stride + 1];
        v[v_stride + 2] = (double)*local_210 * Ns.y + (double)local_210[1] * N.y + v[v_stride + 2];
        v[v_stride << 1] =
             (double)*local_210 * (double)local_1e8 + (double)local_210[2] * Ns.z + v[v_stride << 1]
        ;
        iVar1 = v_stride * 2 + 1;
        v[iVar1] = (double)*local_210 * Nt.x + (double)local_210[2] * N.x + v[iVar1];
        iVar1 = v_stride * 2 + 2;
        v[iVar1] = (double)*local_210 * Nt.y + (double)local_210[2] * N.y + v[iVar1];
      }
    }
    if (local_210 != &d) {
      onfree(local_210);
    }
  }
  return (bool)(darray[0x14]._7_1_ & 1);
}

Assistant:

bool ON_OffsetSurface::Evaluate(
       double s, double t,
       int der_count,
       int v_stride,
       double* v,
       int side,
       int* hint
       ) const
{
  int vv_stride = v_stride;
  double* vv = v;
  ON_3dVector srf_value[6];//, normal_value[3];
  if ( der_count < 2 )
  {
    vv = &srf_value[0].x;
    vv_stride = 3;
  }

  bool rc = ON_SurfaceProxy::Evaluate(s,t,(der_count>2?der_count:2),vv_stride,vv,side,hint);

  if ( v != vv )
  {
    // save answer in v[] array
    v[0] = srf_value[0].x;
    v[1] = srf_value[0].y;
    v[2] = srf_value[0].z;
    if ( der_count > 0 )
    {
      v[v_stride]   = srf_value[1].x;
      v[v_stride+1] = srf_value[1].y;
      v[v_stride+2] = srf_value[1].z;
      v[2*v_stride]   = srf_value[2].x;
      v[2*v_stride+1] = srf_value[2].y;
      v[2*v_stride+2] = srf_value[2].z;
    }
  }
  else
  {
    srf_value[0] = v;
    srf_value[1] = v+v_stride;
    srf_value[2] = v+2*v_stride;
    srf_value[3] = v+3*v_stride;
    srf_value[4] = v+4*v_stride;
    srf_value[5] = v+5*v_stride;
  }

  if (rc)
  {
    double darray[21]; // 21 = ((5+1)*(5+2)/2) = enough room for der_count <= 5
    double* d = (der_count>5)
              ? (double*)onmalloc(((der_count+1)*(der_count+2))/2*sizeof(d[0]))
              : darray;
    rc = m_offset_function.EvaluateDistance(s,t,der_count,d);
    if (rc)
    {
      ON_3dVector N;
      ON_EvNormal(side,
                  srf_value[1], srf_value[2],
                  srf_value[3], srf_value[4], srf_value[5],
                  N);
      v[0] += d[0]*N.x;
      v[1] += d[0]*N.y;
      v[2] += d[0]*N.z;

      if ( der_count > 0 )
      {
        ON_3dVector Ns, Nt;
        ON_EvNormalPartials(srf_value[1], srf_value[2],
                  srf_value[3], srf_value[4], srf_value[5],
                  Ns, Nt);
        v[v_stride]   += d[0]*Ns.x + d[1]*N.x;
        v[v_stride+1] += d[0]*Ns.y + d[1]*N.y;
        v[v_stride+2] += d[0]*Ns.z + d[1]*N.z;

        v[2*v_stride]   += d[0]*Nt.x + d[2]*N.x;
        v[2*v_stride+1] += d[0]*Nt.y + d[2]*N.y;
        v[2*v_stride+2] += d[0]*Nt.z + d[2]*N.z;
      }
    }
    if ( d != darray )
      onfree(d);
  }

  return rc;
}